

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

void alcProcessContext(ALCcontext *_ctx)

{
  DeviceWrapper *device;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alcProcessContext);
  IO_UINT64((uint64)_ctx);
  if (_ctx == (ALCcontext *)0x0) {
    device = (DeviceWrapper *)0x0;
    (*REAL_alcProcessContext)((ALCcontext *)0x0);
  }
  else {
    (*REAL_alcProcessContext)(*(ALCcontext **)_ctx);
    device = *(DeviceWrapper **)(_ctx + 8);
  }
  check_alc_error_events(device);
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alcProcessContext(ALCcontext *_ctx)
{
    ContextWrapper *ctx = (ContextWrapper *) _ctx;
    IO_START(alcProcessContext);
    IO_PTR(ctx);
    REAL_alcProcessContext(ctx ? ctx->ctx : NULL);
    IO_END_ALC(ctx ? ctx->device : NULL);
}